

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3TransferBindings(sqlite3_stmt *pFromStmt,sqlite3_stmt *pToStmt)

{
  Mem *p;
  MemValue *pMVar1;
  long lVar2;
  long lVar3;
  sqlite3_mutex *psVar4;
  MemValue MVar5;
  MemValue MVar6;
  MemValue MVar7;
  MemValue MVar8;
  MemValue MVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  
  if (*(sqlite3_mutex **)(*(long *)pToStmt + 0x18) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(*(long *)pToStmt + 0x18));
  }
  if (0 < *(short *)(pFromStmt + 0x20)) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      lVar2 = *(long *)(pToStmt + 0x80);
      p = (Mem *)(lVar2 + lVar11);
      lVar3 = *(long *)(pFromStmt + 0x80);
      if (((*(byte *)(lVar2 + 0x15 + lVar11) & 0x90) != 0) || (*(int *)(lVar2 + 0x20 + lVar11) != 0)
         ) {
        vdbeMemClear(p);
      }
      pMVar1 = (MemValue *)(lVar11 + lVar3);
      p->xDel = (_func_void_void_ptr *)pMVar1[6];
      MVar5 = *pMVar1;
      MVar6 = pMVar1[1];
      MVar7 = pMVar1[2];
      MVar8 = pMVar1[3];
      MVar9 = pMVar1[5];
      *(MemValue *)&p->szMalloc = pMVar1[4];
      p->zMalloc = (char *)MVar9;
      *(MemValue *)&p->n = MVar7;
      p->db = (sqlite3 *)MVar8;
      p->u = MVar5;
      p->z = (char *)MVar6;
      *(undefined2 *)(lVar3 + 0x14 + lVar11) = 1;
      *(undefined4 *)(lVar3 + 0x20 + lVar11) = 0;
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x38;
    } while (lVar12 < *(short *)(pFromStmt + 0x20));
  }
  psVar4 = *(sqlite3_mutex **)(*(long *)pToStmt + 0x18);
  if (psVar4 != (sqlite3_mutex *)0x0) {
    iVar10 = (*sqlite3Config.mutex.xMutexLeave)(psVar4);
    return iVar10;
  }
  return (int)*(long *)pToStmt;
}

Assistant:

SQLITE_PRIVATE int sqlite3TransferBindings(sqlite3_stmt *pFromStmt, sqlite3_stmt *pToStmt){
  Vdbe *pFrom = (Vdbe*)pFromStmt;
  Vdbe *pTo = (Vdbe*)pToStmt;
  int i;
  assert( pTo->db==pFrom->db );
  assert( pTo->nVar==pFrom->nVar );
  sqlite3_mutex_enter(pTo->db->mutex);
  for(i=0; i<pFrom->nVar; i++){
    sqlite3VdbeMemMove(&pTo->aVar[i], &pFrom->aVar[i]);
  }
  sqlite3_mutex_leave(pTo->db->mutex);
  return SQLITE_OK;
}